

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maplayers.cpp
# Opt level: O0

void __thiscall CMapLayers::OnRender(CMapLayers *this)

{
  long lVar1;
  vec2 vVar2;
  vec4 Color_00;
  vec4 Color_01;
  vec4 Color_02;
  bool bVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  CTextureHandle CVar8;
  IClient *pIVar9;
  IGraphics *pIVar10;
  vec2 *pvVar11;
  CMapItemGroup *pCVar12;
  CConfig *pCVar13;
  CMapItemLayerTilemap *pCVar14;
  CMapItemLayerTilemap *pCVar15;
  IInput *pIVar16;
  IStorage *pIVar17;
  undefined4 extraout_var;
  IMap *pIVar18;
  undefined4 extraout_var_00;
  long in_FS_OFFSET;
  bool bVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  CMapLayers *in_stack_ffffffffffffd988;
  CUI *in_stack_ffffffffffffd990;
  undefined4 uVar24;
  undefined4 uVar25;
  int in_stack_ffffffffffffd99c;
  CGameClient *in_stack_ffffffffffffd9a0;
  CMapItemGroup *in_stack_ffffffffffffd9a8;
  CTile *in_stack_ffffffffffffd9b0;
  int in_stack_ffffffffffffd9b8;
  int in_stack_ffffffffffffd9bc;
  undefined4 in_stack_ffffffffffffd9e8;
  CMapItemGroup *pCVar26;
  int in_stack_ffffffffffffd9f8;
  float in_stack_ffffffffffffda00;
  float in_stack_ffffffffffffda04;
  float in_stack_ffffffffffffda08;
  float in_stack_ffffffffffffda0c;
  IGraphics *in_stack_ffffffffffffda10;
  int in_stack_ffffffffffffda18;
  anon_union_4_2_94730017_for_vector4_base<float>_7 in_stack_ffffffffffffda1c;
  uint in_stack_ffffffffffffda20;
  uint in_stack_ffffffffffffda24;
  CRenderTools *in_stack_ffffffffffffda28;
  CMapItemLayer *pNextLayer;
  CQuad *pQuads;
  int in_stack_ffffffffffffda68;
  CMapItemLayerQuads *pQLayer;
  CTile *pTiles_1;
  CMapItemLayerTilemap *pTMap_1;
  int x;
  int y;
  IOHANDLE File;
  CTile *pTiles;
  CMapItemLayerTilemap *pTMap;
  bool IsGameLayer;
  bool Render;
  CMapItemLayer *pLayer;
  int l;
  float y1;
  float x1;
  float y0;
  float x0;
  CMapItemGroup *pGroup;
  int g;
  bool PassedGameLayer;
  CLayers *pLayers;
  CMapLayers *this_local;
  vector4_base<float> local_2508;
  vec4 local_24f8;
  vec4 local_24e8;
  vec4 Color;
  vec2 Center;
  CUIRect Screen;
  char aFilename [512];
  CServerInfo CurrentServerInfo;
  float Points [4];
  
  CurrentServerInfo.m_aClients[0x21].m_aName[0x14] = '\0';
  CurrentServerInfo.m_aClients[0x21].m_aName[0x15] = '\0';
  CurrentServerInfo.m_aClients[0x21].m_aName[0x16] = '\0';
  CurrentServerInfo.m_aClients[0x21].m_aName[0x17] = '\0';
  CurrentServerInfo.m_aClients[0x21].m_aName[0x18] = '\0';
  CurrentServerInfo.m_aClients[0x21].m_aName[0x19] = '\0';
  CurrentServerInfo.m_aClients[0x21].m_aName[0x1a] = '\0';
  CurrentServerInfo.m_aClients[0x21].m_aName[0x1b] = '\0';
  CurrentServerInfo.m_aClients[2].m_aName[0x10] = '\0';
  CurrentServerInfo.m_aClients[2].m_aName[0x11] = '\0';
  CurrentServerInfo.m_aClients[2].m_aName[0x12] = '\0';
  CurrentServerInfo.m_aClients[2].m_aName[0x13] = '\0';
  CurrentServerInfo.m_aClients[2].m_aName[0x14] = '\0';
  CurrentServerInfo.m_aClients[2].m_aName[0x15] = '\0';
  CurrentServerInfo.m_aClients[2].m_aName[0x16] = '\0';
  CurrentServerInfo.m_aClients[2].m_aName[0x17] = '\0';
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pLayers = (CLayers *)0x0;
  pIVar9 = CComponent::Client((CComponent *)0x16fd93);
  iVar5 = IClient::State(pIVar9);
  if (iVar5 != 3) {
    pIVar9 = CComponent::Client((CComponent *)0x16fdad);
    iVar5 = IClient::State(pIVar9);
    if (iVar5 != 4) {
      if ((this->m_pMenuMap != (IEngineMap *)0x0) &&
         (uVar7 = (*(this->m_pMenuMap->super_IMap).super_IInterface._vptr_IInterface[10])(),
         (uVar7 & 1) != 0)) {
        pLayers = this->m_pMenuLayers;
      }
      goto LAB_0016fe0e;
    }
  }
  pLayers = CComponent::Layers((CComponent *)0x16fdc7);
LAB_0016fe0e:
  if (pLayers != (CLayers *)0x0) {
    pIVar10 = CComponent::Graphics((CComponent *)0x16fe2b);
    (*(pIVar10->super_IInterface)._vptr_IInterface[6])
              (pIVar10,&Screen,&Screen.y,&Screen.w,&Screen.h);
    pvVar11 = CCamera::GetCenter(((this->super_CComponent).m_pClient)->m_pCamera);
    vVar2 = *pvVar11;
    bVar3 = false;
    g = 0;
    while (iVar5 = g, iVar6 = CLayers::NumGroups(pLayers), iVar5 < iVar6) {
      pCVar12 = CLayers::GetGroup((CLayers *)in_stack_ffffffffffffd990,
                                  (int)((ulong)in_stack_ffffffffffffd988 >> 0x20));
      pCVar13 = CComponent::Config((CComponent *)0x16feeb);
      Center.field_0 = vVar2.field_0;
      Center.field_1 = vVar2.field_1;
      if (((pCVar13->m_GfxNoclip == 0) && (1 < (pCVar12->super_CMapItemGroup_v1).m_Version)) &&
         (pCVar12->m_UseClipping != 0)) {
        in_stack_ffffffffffffda28 = CComponent::RenderTools((CComponent *)0x16ff28);
        CLayers::GameGroup(pLayers);
        CCamera::GetZoom(((this->super_CComponent).m_pClient)->m_pCamera);
        CRenderTools::MapScreenToGroup
                  ((CRenderTools *)CONCAT44(in_stack_ffffffffffffd9bc,in_stack_ffffffffffffd9b8),
                   (float)((ulong)in_stack_ffffffffffffd9b0 >> 0x20),
                   SUB84(in_stack_ffffffffffffd9b0,0),in_stack_ffffffffffffd9a8,
                   (float)((ulong)in_stack_ffffffffffffd9a0 >> 0x20));
        pIVar10 = CComponent::Graphics((CComponent *)0x16ffbb);
        (*(pIVar10->super_IInterface)._vptr_IInterface[6])
                  (pIVar10,Points,Points + 1,Points + 2,Points + 3);
        fVar20 = ((float)pCVar12->m_ClipX - Points[0]) / (Points[2] - Points[0]);
        fVar21 = ((float)pCVar12->m_ClipY - Points[1]) / (Points[3] - Points[1]);
        fVar22 = ((float)(pCVar12->m_ClipX + pCVar12->m_ClipW) - Points[0]) /
                 (Points[2] - Points[0]);
        fVar23 = ((float)(pCVar12->m_ClipY + pCVar12->m_ClipH) - Points[1]) /
                 (Points[3] - Points[1]);
        if (((0.0 <= fVar22) && (fVar20 <= 1.0)) && ((0.0 <= fVar23 && (fVar21 <= 1.0)))) {
          in_stack_ffffffffffffda10 = CComponent::Graphics((CComponent *)0x170136);
          in_stack_ffffffffffffda00 = fVar20;
          pIVar10 = CComponent::Graphics((CComponent *)0x17015a);
          iVar5 = IGraphics::ScreenWidth(pIVar10);
          in_stack_ffffffffffffda1c =
               (anon_union_4_2_94730017_for_vector4_base<float>_7)
               (int)(in_stack_ffffffffffffda00 * (float)iVar5);
          in_stack_ffffffffffffda04 = fVar21;
          pIVar10 = CComponent::Graphics((CComponent *)0x170197);
          iVar5 = IGraphics::ScreenHeight(pIVar10);
          in_stack_ffffffffffffda20 = (uint)(in_stack_ffffffffffffda04 * (float)iVar5);
          in_stack_ffffffffffffda08 = fVar22 - fVar20;
          pIVar10 = CComponent::Graphics((CComponent *)0x1701e0);
          iVar5 = IGraphics::ScreenWidth(pIVar10);
          in_stack_ffffffffffffda24 = (uint)(in_stack_ffffffffffffda08 * (float)iVar5);
          in_stack_ffffffffffffda0c = fVar23 - fVar21;
          pIVar10 = CComponent::Graphics((CComponent *)0x17022c);
          iVar5 = IGraphics::ScreenHeight(pIVar10);
          (*(in_stack_ffffffffffffda10->super_IInterface)._vptr_IInterface[3])
                    (in_stack_ffffffffffffda10,(ulong)(uint)in_stack_ffffffffffffda1c,
                     (ulong)in_stack_ffffffffffffda20,(ulong)in_stack_ffffffffffffda24,
                     (ulong)(uint)(int)(in_stack_ffffffffffffda0c * (float)iVar5));
          goto LAB_0017026d;
        }
      }
      else {
LAB_0017026d:
        CComponent::RenderTools((CComponent *)0x17027a);
        pCVar26 = pCVar12;
        CCamera::GetZoom(((this->super_CComponent).m_pClient)->m_pCamera);
        CRenderTools::MapScreenToGroup
                  ((CRenderTools *)CONCAT44(in_stack_ffffffffffffd9bc,in_stack_ffffffffffffd9b8),
                   (float)((ulong)in_stack_ffffffffffffd9b0 >> 0x20),
                   SUB84(in_stack_ffffffffffffd9b0,0),in_stack_ffffffffffffd9a8,
                   (float)((ulong)in_stack_ffffffffffffd9a0 >> 0x20));
        for (l = 0; l < (pCVar12->super_CMapItemGroup_v1).m_NumLayers; l = l + 1) {
          pCVar14 = (CMapItemLayerTilemap *)
                    CLayers::GetLayer((CLayers *)in_stack_ffffffffffffd990,
                                      (int)((ulong)in_stack_ffffffffffffd988 >> 0x20));
          bVar4 = false;
          pCVar15 = CLayers::GameLayer(pLayers);
          bVar19 = pCVar14 == pCVar15;
          if (bVar19) {
            bVar3 = true;
          }
          if (this->m_Type == -1) {
            bVar4 = true;
          }
          else if (this->m_Type == 0) {
            if (bVar3) {
              pIVar9 = CComponent::Client((CComponent *)0x1703b1);
              iVar5 = IClient::State(pIVar9);
              if (iVar5 == 3) goto LAB_00170cbd;
              pIVar9 = CComponent::Client((CComponent *)0x1703cb);
              iVar5 = IClient::State(pIVar9);
              if (iVar5 == 4) goto LAB_00170cbd;
            }
            bVar4 = true;
          }
          else if ((bVar3) && (!bVar19)) {
            bVar4 = true;
          }
          if (bVar4) {
            if (((((pCVar14->m_Layer).m_Flags & 1U) == 0) ||
                (pCVar13 = CComponent::Config((CComponent *)0x170436), pCVar13->m_GfxHighDetail != 0
                )) || (bVar19)) {
LAB_00170485:
              if ((pCVar14->m_Layer).m_Type == 2) {
                pIVar16 = CComponent::Input((CComponent *)0x1704a4);
                uVar7 = (*(pIVar16->super_IInterface)._vptr_IInterface[4])(pIVar16,0x160);
                if ((uVar7 & 1) != 0) {
                  pIVar16 = CComponent::Input((CComponent *)0x1704c8);
                  uVar7 = (*(pIVar16->super_IInterface)._vptr_IInterface[4])(pIVar16,0x161);
                  if ((uVar7 & 1) != 0) {
                    CComponent::UI((CComponent *)0x1704ec);
                    bVar4 = CUI::KeyPress(in_stack_ffffffffffffd990,
                                          (int)((ulong)in_stack_ffffffffffffd988 >> 0x20));
                    uVar25 = (undefined4)((ulong)in_stack_ffffffffffffd988 >> 0x20);
                    if (bVar4) {
                      pIVar18 = CLayers::Map(pLayers);
                      uVar24 = (undefined4)((ulong)in_stack_ffffffffffffd990 >> 0x20);
                      (*(pIVar18->super_IInterface)._vptr_IInterface[2])
                                (pIVar18,(ulong)(uint)pCVar14->m_Data);
                      pIVar9 = CComponent::Client((CComponent *)0x170548);
                      (*(pIVar9->super_IInterface)._vptr_IInterface[0x1d])
                                (pIVar9,&CurrentServerInfo);
                      str_format(aFilename,0x200,"dumps/tilelayer_dump_%s-%d-%d-%dx%d.txt",
                                 CurrentServerInfo.m_aMap,(ulong)(uint)g,(ulong)(uint)l,
                                 CONCAT44(uVar25,pCVar14->m_Width),
                                 CONCAT44(uVar24,pCVar14->m_Height));
                      pIVar17 = CComponent::Storage((CComponent *)0x1705c2);
                      in_stack_ffffffffffffd988 = (CMapLayers *)0x0;
                      in_stack_ffffffffffffd990 = (CUI *)0x0;
                      iVar5 = (*(pIVar17->super_IInterface)._vptr_IInterface[4])
                                        (pIVar17,aFilename,2,0,0);
                      if (CONCAT44(extraout_var,iVar5) != 0) {
                        for (y = 0; y < pCVar14->m_Height; y = y + 1) {
                          for (x = 0; x < pCVar14->m_Width; x = x + 1) {
                            io_write((IOHANDLE)in_stack_ffffffffffffd990,in_stack_ffffffffffffd988,0
                                    );
                          }
                          io_write_newline((IOHANDLE)0x1706aa);
                        }
                        io_close((IOHANDLE)0x1706cd);
                      }
                    }
                  }
                }
              }
              if (!bVar19) {
                if ((pCVar14->m_Layer).m_Type == 2) {
                  if (pCVar14->m_Image == -1) {
                    CComponent::Graphics((CComponent *)0x17071a);
                    IGraphics::TextureClear((IGraphics *)in_stack_ffffffffffffd990);
                    uVar25 = (undefined4)((ulong)in_stack_ffffffffffffd990 >> 0x20);
                    in_stack_ffffffffffffd988 = this;
                  }
                  else {
                    pIVar10 = CComponent::Graphics((CComponent *)0x170731);
                    uVar25 = (undefined4)((ulong)in_stack_ffffffffffffd990 >> 0x20);
                    CVar8 = CMapImages::Get((CMapImages *)in_stack_ffffffffffffd9a0,
                                            in_stack_ffffffffffffd99c);
                    (*(pIVar10->super_IInterface)._vptr_IInterface[0x13])
                              (pIVar10,(ulong)(uint)CVar8.m_Id);
                    in_stack_ffffffffffffd988 = this;
                  }
                  pIVar18 = CLayers::Map(pLayers);
                  (*(pIVar18->super_IInterface)._vptr_IInterface[2])
                            (pIVar18,(ulong)(uint)pCVar14->m_Data);
                  pIVar10 = CComponent::Graphics((CComponent *)0x1707b1);
                  (*(pIVar10->super_IInterface)._vptr_IInterface[7])();
                  vector4_base<float>::vector4_base
                            (&Color,(float)(pCVar14->m_Color).r / 255.0,
                             (float)(pCVar14->m_Color).g / 255.0,(float)(pCVar14->m_Color).b / 255.0
                             ,(float)(pCVar14->m_Color).a / 255.0);
                  CComponent::RenderTools((CComponent *)0x17080b);
                  local_24e8.field_0 = Color.field_0;
                  local_24e8.field_1 = Color.field_1;
                  local_24e8.field_2 = Color.field_2;
                  local_24e8.field_3 = Color.field_3;
                  Color_00.field_2 =
                       (anon_union_4_2_94730039_for_vector4_base<float>_5)in_stack_ffffffffffffda18;
                  Color_00._0_8_ = in_stack_ffffffffffffda10;
                  Color_00.field_3 = in_stack_ffffffffffffda1c;
                  CRenderTools::RenderTilemap
                            ((CRenderTools *)
                             CONCAT44(in_stack_ffffffffffffda0c,in_stack_ffffffffffffda08),
                             (CTile *)CONCAT44(in_stack_ffffffffffffda04,in_stack_ffffffffffffda00),
                             (int)Center.field_0,in_stack_ffffffffffffd9f8,
                             (float)((ulong)pCVar26 >> 0x20),Color_00,(int)pCVar26,
                             (ENVELOPE_EVAL)CONCAT44(Center.field_1,in_stack_ffffffffffffd9e8),
                             pQuads,in_stack_ffffffffffffda68,(int)pQLayer);
                  pIVar10 = CComponent::Graphics((CComponent *)0x170893);
                  (*(pIVar10->super_IInterface)._vptr_IInterface[8])();
                  CComponent::RenderTools((CComponent *)0x1708ac);
                  local_24f8.field_0 = Color.field_0;
                  local_24f8.field_1 = Color.field_1;
                  local_24f8.field_2 = Color.field_2;
                  local_24f8.field_3 = Color.field_3;
                  in_stack_ffffffffffffd990 = (CUI *)CONCAT44(uVar25,pCVar14->m_ColorEnv);
                  Color_01.field_2 =
                       (anon_union_4_2_94730039_for_vector4_base<float>_5)in_stack_ffffffffffffda18;
                  Color_01._0_8_ = in_stack_ffffffffffffda10;
                  Color_01.field_3 = in_stack_ffffffffffffda1c;
                  this = in_stack_ffffffffffffd988;
                  CRenderTools::RenderTilemap
                            ((CRenderTools *)
                             CONCAT44(in_stack_ffffffffffffda0c,in_stack_ffffffffffffda08),
                             (CTile *)CONCAT44(in_stack_ffffffffffffda04,in_stack_ffffffffffffda00),
                             (int)Center.field_0,in_stack_ffffffffffffd9f8,
                             (float)((ulong)pCVar26 >> 0x20),Color_01,(int)pCVar26,
                             (ENVELOPE_EVAL)CONCAT44(Center.field_1,in_stack_ffffffffffffd9e8),
                             pQuads,in_stack_ffffffffffffda68,(int)pQLayer);
                }
                else if ((pCVar14->m_Layer).m_Type == 3) {
                  if (pCVar14->m_Flags == -1) {
                    CComponent::Graphics((CComponent *)0x170969);
                    IGraphics::TextureClear((IGraphics *)in_stack_ffffffffffffd990);
                  }
                  else {
                    pIVar10 = CComponent::Graphics((CComponent *)0x170980);
                    CVar8 = CMapImages::Get((CMapImages *)in_stack_ffffffffffffd9a0,
                                            in_stack_ffffffffffffd99c);
                    (*(pIVar10->super_IInterface)._vptr_IInterface[0x13])
                              (pIVar10,(ulong)(uint)CVar8.m_Id);
                  }
                  pIVar18 = CLayers::Map(pLayers);
                  iVar5 = (*(pIVar18->super_IInterface)._vptr_IInterface[3])
                                    (pIVar18,(ulong)(uint)pCVar14->m_Height);
                  pQuads = (CQuad *)CONCAT44(extraout_var_00,iVar5);
                  pIVar10 = CComponent::Graphics((CComponent *)0x1709fd);
                  (*(pIVar10->super_IInterface)._vptr_IInterface[8])();
                  CComponent::RenderTools((CComponent *)0x170a13);
                  CRenderTools::RenderQuads
                            (in_stack_ffffffffffffda28,
                             (CQuad *)CONCAT44(in_stack_ffffffffffffda24,in_stack_ffffffffffffda20),
                             (int)in_stack_ffffffffffffda1c,in_stack_ffffffffffffda18,
                             (ENVELOPE_EVAL)in_stack_ffffffffffffda10,
                             (void *)CONCAT44(in_stack_ffffffffffffda0c,in_stack_ffffffffffffda08));
                  pQLayer = (CMapItemLayerQuads *)pCVar14;
                }
              }
            }
            else {
              pIVar9 = CComponent::Client((CComponent *)0x170456);
              iVar5 = IClient::State(pIVar9);
              if (iVar5 != 3) {
                pIVar9 = CComponent::Client((CComponent *)0x170474);
                iVar5 = IClient::State(pIVar9);
                if (iVar5 != 4) goto LAB_00170485;
              }
            }
            bVar4 = CGameClient::IsEaster(in_stack_ffffffffffffd9a0);
            if (((bVar4) &&
                (pCVar14 = (CMapItemLayerTilemap *)
                           CLayers::GetLayer((CLayers *)in_stack_ffffffffffffd990,
                                             (int)((ulong)in_stack_ffffffffffffd988 >> 0x20)),
                this->m_pEggTiles != (CTile *)0x0)) &&
               ((l + 1 < (pCVar12->super_CMapItemGroup_v1).m_NumLayers &&
                (pCVar15 = CLayers::GameLayer(pLayers), pCVar14 == pCVar15)))) {
              in_stack_ffffffffffffd9a0 =
                   (CGameClient *)CComponent::Graphics((CComponent *)0x170af5);
              CVar8 = CMapImages::GetEasterTexture((CMapImages *)in_stack_ffffffffffffd990);
              uVar25 = (undefined4)((ulong)in_stack_ffffffffffffd990 >> 0x20);
              (*((CComponent *)&in_stack_ffffffffffffd9a0->super_IGameClient)->_vptr_CComponent
                [0x13])(in_stack_ffffffffffffd9a0,(ulong)(uint)CVar8.m_Id);
              pIVar10 = CComponent::Graphics((CComponent *)0x170b41);
              (*(pIVar10->super_IInterface)._vptr_IInterface[8])();
              in_stack_ffffffffffffd9a8 =
                   (CMapItemGroup *)CComponent::RenderTools((CComponent *)0x170b5a);
              in_stack_ffffffffffffd9b0 = this->m_pEggTiles;
              in_stack_ffffffffffffd9b8 = this->m_EggLayerWidth;
              in_stack_ffffffffffffd9bc = this->m_EggLayerHeight;
              in_stack_ffffffffffffd988 = this;
              vector4_base<float>::vector4_base(&local_2508,1.0,1.0,1.0,1.0);
              in_stack_ffffffffffffd990 = (CUI *)CONCAT44(uVar25,0xffffffff);
              Color_02.field_2 =
                   (anon_union_4_2_94730039_for_vector4_base<float>_5)in_stack_ffffffffffffda18;
              Color_02._0_8_ = in_stack_ffffffffffffda10;
              Color_02.field_3 = in_stack_ffffffffffffda1c;
              this = in_stack_ffffffffffffd988;
              CRenderTools::RenderTilemap
                        ((CRenderTools *)
                         CONCAT44(in_stack_ffffffffffffda0c,in_stack_ffffffffffffda08),
                         (CTile *)CONCAT44(in_stack_ffffffffffffda04,in_stack_ffffffffffffda00),
                         (int)Center.field_0,in_stack_ffffffffffffd9f8,
                         (float)((ulong)pCVar26 >> 0x20),Color_02,(int)pCVar26,
                         (ENVELOPE_EVAL)CONCAT44(Center.field_1,in_stack_ffffffffffffd9e8),pQuads,
                         in_stack_ffffffffffffda68,(int)pQLayer);
            }
          }
        }
        pCVar13 = CComponent::Config((CComponent *)0x170c20);
        if (pCVar13->m_GfxNoclip == 0) {
          pIVar10 = CComponent::Graphics((CComponent *)0x170c36);
          (*(pIVar10->super_IInterface)._vptr_IInterface[4])();
        }
      }
      g = g + 1;
    }
    pCVar13 = CComponent::Config((CComponent *)0x170c64);
    if (pCVar13->m_GfxNoclip == 0) {
      pIVar10 = CComponent::Graphics((CComponent *)0x170c7a);
      (*(pIVar10->super_IInterface)._vptr_IInterface[4])();
    }
    pIVar10 = CComponent::Graphics((CComponent *)0x170c90);
    (*(pIVar10->super_IInterface)._vptr_IInterface[5])
              (Screen.x,(ulong)(uint)Screen.y,(ulong)(uint)Screen.w,Screen.h);
  }
LAB_00170cbd:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void CMapLayers::OnRender()
{
	CLayers *pLayers = 0;
	if(Client()->State() == IClient::STATE_ONLINE || Client()->State() == IClient::STATE_DEMOPLAYBACK)
		pLayers = Layers();
	else if(m_pMenuMap && m_pMenuMap->IsLoaded())
		pLayers = m_pMenuLayers;

	if(!pLayers)
		return;

	CUIRect Screen;
	Graphics()->GetScreen(&Screen.x, &Screen.y, &Screen.w, &Screen.h);

	vec2 Center = *m_pClient->m_pCamera->GetCenter();

	bool PassedGameLayer = false;

	for(int g = 0; g < pLayers->NumGroups(); g++)
	{
		CMapItemGroup *pGroup = pLayers->GetGroup(g);

		if(!Config()->m_GfxNoclip && pGroup->m_Version >= 2 && pGroup->m_UseClipping)
		{
			// set clipping
			float Points[4];
			RenderTools()->MapScreenToGroup(Center.x, Center.y, pLayers->GameGroup(), m_pClient->m_pCamera->GetZoom());
			Graphics()->GetScreen(&Points[0], &Points[1], &Points[2], &Points[3]);
			float x0 = (pGroup->m_ClipX - Points[0]) / (Points[2]-Points[0]);
			float y0 = (pGroup->m_ClipY - Points[1]) / (Points[3]-Points[1]);
			float x1 = ((pGroup->m_ClipX+pGroup->m_ClipW) - Points[0]) / (Points[2]-Points[0]);
			float y1 = ((pGroup->m_ClipY+pGroup->m_ClipH) - Points[1]) / (Points[3]-Points[1]);

			if(x1 < 0.0f || x0 > 1.0f || y1 < 0.0f || y0 > 1.0f)
				continue;

			Graphics()->ClipEnable((int)(x0*Graphics()->ScreenWidth()), (int)(y0*Graphics()->ScreenHeight()),
				(int)((x1-x0)*Graphics()->ScreenWidth()), (int)((y1-y0)*Graphics()->ScreenHeight()));
		}

		RenderTools()->MapScreenToGroup(Center.x, Center.y, pGroup, m_pClient->m_pCamera->GetZoom());

		for(int l = 0; l < pGroup->m_NumLayers; l++)
		{
			CMapItemLayer *pLayer = pLayers->GetLayer(pGroup->m_StartLayer+l);
			bool Render = false;
			bool IsGameLayer = false;

			if(pLayer == (CMapItemLayer*)pLayers->GameLayer())
			{
				IsGameLayer = true;
				PassedGameLayer = true;
			}

			if(m_Type == -1)
				Render = true;
			else if(m_Type == 0)
			{
				if(PassedGameLayer && (Client()->State() == IClient::STATE_ONLINE || Client()->State() == IClient::STATE_DEMOPLAYBACK))
					return;
				Render = true;
			}
			else
			{
				if(PassedGameLayer && !IsGameLayer)
					Render = true;
			}

			if(!Render)
				continue;

			// skip rendering if detail layers is not wanted
			if(!(pLayer->m_Flags&LAYERFLAG_DETAIL && !Config()->m_GfxHighDetail && !IsGameLayer && (Client()->State() == IClient::STATE_ONLINE || Client()->State() == IClient::STATE_DEMOPLAYBACK)))
			{
				if(pLayer->m_Type == LAYERTYPE_TILES && Input()->KeyIsPressed(KEY_LCTRL) && Input()->KeyIsPressed(KEY_LSHIFT) && UI()->KeyPress(KEY_KP_0))
				{
					CMapItemLayerTilemap *pTMap = (CMapItemLayerTilemap *)pLayer;
					CTile *pTiles = (CTile *)pLayers->Map()->GetData(pTMap->m_Data);
					CServerInfo CurrentServerInfo;
					Client()->GetServerInfo(&CurrentServerInfo);
					char aFilename[IO_MAX_PATH_LENGTH];
					str_format(aFilename, sizeof(aFilename), "dumps/tilelayer_dump_%s-%d-%d-%dx%d.txt", CurrentServerInfo.m_aMap, g, l, pTMap->m_Width, pTMap->m_Height);
					IOHANDLE File = Storage()->OpenFile(aFilename, IOFLAG_WRITE, IStorage::TYPE_SAVE);
					if(File)
					{
						for(int y = 0; y < pTMap->m_Height; y++)
						{
							for(int x = 0; x < pTMap->m_Width; x++)
								io_write(File, &(pTiles[y*pTMap->m_Width + x].m_Index), sizeof(pTiles[y*pTMap->m_Width + x].m_Index));
							io_write_newline(File);
						}
						io_close(File);
					}
				}

				if(!IsGameLayer)
				{
					if(pLayer->m_Type == LAYERTYPE_TILES)
					{
						CMapItemLayerTilemap *pTMap = (CMapItemLayerTilemap *)pLayer;
						if(pTMap->m_Image == -1)
							Graphics()->TextureClear();
						else
							Graphics()->TextureSet(m_pClient->m_pMapimages->Get(pTMap->m_Image));

						CTile *pTiles = (CTile *)pLayers->Map()->GetData(pTMap->m_Data);
						Graphics()->BlendNone();
						vec4 Color = vec4(pTMap->m_Color.r/255.0f, pTMap->m_Color.g/255.0f, pTMap->m_Color.b/255.0f, pTMap->m_Color.a/255.0f);
						RenderTools()->RenderTilemap(pTiles, pTMap->m_Width, pTMap->m_Height, 32.0f, Color, TILERENDERFLAG_EXTEND|LAYERRENDERFLAG_OPAQUE,
														EnvelopeEval, this, pTMap->m_ColorEnv, pTMap->m_ColorEnvOffset);
						Graphics()->BlendNormal();
						RenderTools()->RenderTilemap(pTiles, pTMap->m_Width, pTMap->m_Height, 32.0f, Color, TILERENDERFLAG_EXTEND|LAYERRENDERFLAG_TRANSPARENT,
														EnvelopeEval, this, pTMap->m_ColorEnv, pTMap->m_ColorEnvOffset);
					}
					else if(pLayer->m_Type == LAYERTYPE_QUADS)
					{
						CMapItemLayerQuads *pQLayer = (CMapItemLayerQuads *)pLayer;
						if(pQLayer->m_Image == -1)
							Graphics()->TextureClear();
						else
							Graphics()->TextureSet(m_pClient->m_pMapimages->Get(pQLayer->m_Image));

						CQuad *pQuads = (CQuad *)pLayers->Map()->GetDataSwapped(pQLayer->m_Data);

						//Graphics()->BlendNone();
						//RenderTools()->RenderQuads(pQuads, pQLayer->m_NumQuads, LAYERRENDERFLAG_OPAQUE, EnvelopeEval, this);
						Graphics()->BlendNormal();
						RenderTools()->RenderQuads(pQuads, pQLayer->m_NumQuads, LAYERRENDERFLAG_TRANSPARENT, EnvelopeEval, this);
					}
				}
			}

			// eggs
			if(m_pClient->IsEaster())
			{
				CMapItemLayer *pNextLayer = pLayers->GetLayer(pGroup->m_StartLayer+l+1);
				if(m_pEggTiles && (l+1) < pGroup->m_NumLayers && pNextLayer == (CMapItemLayer*)pLayers->GameLayer())
				{
					Graphics()->TextureSet(m_pClient->m_pMapimages->GetEasterTexture());
					Graphics()->BlendNormal();
					RenderTools()->RenderTilemap(m_pEggTiles, m_EggLayerWidth, m_EggLayerHeight, 32.0f, vec4(1,1,1,1), LAYERRENDERFLAG_TRANSPARENT, EnvelopeEval, this, -1, 0);
				}
			}
		}
		if(!Config()->m_GfxNoclip)
			Graphics()->ClipDisable();
	}

	if(!Config()->m_GfxNoclip)
		Graphics()->ClipDisable();

	// reset the screen like it was before
	Graphics()->MapScreen(Screen.x, Screen.y, Screen.w, Screen.h);
}